

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O0

size_t zdd_nodecount_mark(ZDD zdd)

{
  int iVar1;
  zddnode_t n_00;
  uint64_t uVar2;
  size_t sVar3;
  size_t sVar4;
  zddnode_t n;
  ZDD zdd_local;
  
  n_00 = ZDD_GETNODE(zdd);
  iVar1 = zddnode_getmark(n_00);
  if (iVar1 == 0) {
    zddnode_setmark(n_00,1);
    uVar2 = zddnode_getlow(n_00);
    sVar3 = zdd_nodecount_mark(uVar2);
    uVar2 = zddnode_gethigh(n_00);
    sVar4 = zdd_nodecount_mark(uVar2);
    zdd_local = sVar3 + 1 + sVar4;
  }
  else {
    zdd_local = 0;
  }
  return zdd_local;
}

Assistant:

static size_t
zdd_nodecount_mark(ZDD zdd)
{
    // Note: the True/False leaf can be marked/unmarked, as buckets 0--1 are unused
    zddnode_t n = ZDD_GETNODE(zdd);
    if (zddnode_getmark(n)) return 0;
    zddnode_setmark(n, 1);
    return 1 + zdd_nodecount_mark(zddnode_getlow(n)) + zdd_nodecount_mark(zddnode_gethigh(n));
}